

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_monte_carlo.cpp
# Opt level: O0

double * monomial_value_1d(int n,int e,double *x)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *pdVar3;
  double dVar4;
  double *v;
  int j;
  double *x_local;
  int e_local;
  int n_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)n;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pdVar3 = (double *)operator_new__(uVar2);
  for (v._4_4_ = 0; v._4_4_ < n; v._4_4_ = v._4_4_ + 1) {
    dVar4 = pow(x[v._4_4_],(double)e);
    pdVar3[v._4_4_] = dVar4;
  }
  return pdVar3;
}

Assistant:

double *monomial_value_1d ( int n, int e, double x[] )

//****************************************************************************80
//
//  Purpose:
//
//    MONOMIAL_VALUE_1D evaluates a monomial in 1D.
//
//  Discussion:
//
//    This routine evaluates a monomial of the form
//
//      product ( 1 <= i <= m ) x(i)^expon(i)
//
//    where the exponents are nonnegative integers.  Note that
//    if the combination 0^0 is encountered, it should be treated
//    as 1.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    17 January 2014
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of points at which the
//    monomial is to be evaluated.
//
//    Input, int E, the exponents.
//
//    Input, double X[N], the point coordinates.
//
//    Output, double MONOMIAL_VALUE_1D[N], the value of the monomial.
//
{
  int j;
  double *v;

  v = new double[n];

  for ( j = 0; j < n; j++ )
  {
    v[j] = pow ( x[j], e );
  }

  return v;
}